

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_selector<2,0,true>::
     run<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,1,_1,false>const>,4>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,false>>
               (GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>,_4>
                *prod,Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>
                      *dest,Scalar *alpha)

{
  PointerArgType pdVar1;
  Index IVar2;
  double *pdVar3;
  Index lhsStride;
  Index rows;
  Index cols;
  Scalar *lhs;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
  *other;
  size_t size;
  Index IVar4;
  _LhsNested *p_Var5;
  _RhsNested *p_Var6;
  ulong uVar7;
  Index IVar8;
  Index rhsIncr;
  ScalarWithConstIfNotLvalue *pSVar9;
  Scalar SVar10;
  Scalar SVar11;
  ScalarWithConstIfNotLvalue SStack_228;
  PointerArgType local_220;
  Index local_218;
  PointerArgType local_210;
  Index local_208;
  Index local_200;
  double *local_1f8;
  Index local_1f0;
  Index local_1e8;
  Index local_1e0;
  Scalar *local_1d8;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
  *local_1d0;
  PointerArgType local_1c8;
  Index local_1c0;
  PointerArgType local_1b8;
  Index local_1b0;
  double *local_1a8;
  size_t local_1a0;
  double *local_198;
  ScalarWithConstIfNotLvalue *local_190;
  ScalarWithConstIfNotLvalue *local_188;
  ScalarWithConstIfNotLvalue *local_180;
  ScalarWithConstIfNotLvalue *local_178;
  ScalarWithConstIfNotLvalue *local_170;
  Scalar local_168;
  double local_160;
  Stride<0,_0> local_152;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_150;
  Stride<0,_0> local_132;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_130;
  ScalarMultipleReturnType local_118;
  Stride<0,_0> local_f2;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_f0;
  Stride<0,_0> local_d6 [7];
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_> local_c8;
  undefined1 local_b0 [8];
  aligned_stack_memory_handler<double> actualDestPtr_stack_memory_destructor;
  ResScalar *actualDestPtr;
  RhsScalar compatibleAlpha;
  bool evalToDest;
  bool alphaIsCompatible;
  double dStack_80;
  gemv_static_vector_if<double,__1,__1,_false> static_dest;
  ResScalar actualAlpha;
  ActualRhsType actualRhs;
  ActualLhsType actualLhs;
  Scalar *alpha_local;
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>
  *dest_local;
  GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>,_4>
  *prod_local;
  
  p_Var5 = ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>_>,_4>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>_>_>
           ::lhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>_>
                );
  actualRhs.m_matrix.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
  .m_outerStride =
       (Index)blas_traits<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>
              ::extract(p_Var5);
  p_Var6 = ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>_>,_4>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>_>_>
           ::rhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>_>
                );
  blas_traits<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>_>_>
  ::extract((ExtractType *)&actualAlpha,p_Var6);
  local_168 = *alpha;
  p_Var5 = ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>_>,_4>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>_>_>
           ::lhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>_>
                );
  SVar10 = blas_traits<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>
           ::extractScalarFactor(p_Var5);
  local_160 = local_168 * SVar10;
  p_Var6 = ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>_>,_4>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>_>_>
           ::rhs(&prod->
                  super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>_>_>
                );
  SVar11 = blas_traits<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>_>_>
           ::extractScalarFactor(p_Var6);
  dStack_80 = local_160 * SVar11;
  compatibleAlpha._6_1_ = 1;
  compatibleAlpha._5_1_ = 1;
  actualDestPtr = (ResScalar *)get_factor<double,_double>::run(&stack0xffffffffffffff80);
  uVar7 = EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>
          ::size((EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
                  *)dest);
  if (0x1fffffffffffffff < uVar7) {
    throw_std_bad_alloc();
  }
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    local_170 = gemv_static_vector_if<double,_-1,_-1,_false>::data
                          ((gemv_static_vector_if<double,__1,__1,_false> *)
                           ((long)&compatibleAlpha + 7));
  }
  else {
    local_170 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_1>
                ::data((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_1>
                        *)dest);
  }
  if (local_170 == (ScalarWithConstIfNotLvalue *)0x0) {
    IVar8 = EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>
            ::size((EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
                    *)dest);
    pSVar9 = &SStack_228;
    if ((ulong)(IVar8 * 8) < 0x20001) {
      IVar8 = EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>
              ::size((EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
                      *)dest);
      pSVar9 = (ScalarWithConstIfNotLvalue *)
               ((long)&SStack_228 - (IVar8 * 8 + 0xfU & 0xfffffffffffffff0));
      local_188 = pSVar9;
    }
    else {
      IVar8 = EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>
              ::size((EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
                      *)dest);
      local_188 = (ScalarWithConstIfNotLvalue *)aligned_malloc(IVar8 << 3);
    }
    local_180 = local_188;
  }
  else {
    if ((compatibleAlpha._5_1_ & 1) == 0) {
      local_178 = gemv_static_vector_if<double,_-1,_-1,_false>::data
                            ((gemv_static_vector_if<double,__1,__1,_false> *)
                             ((long)&compatibleAlpha + 7));
    }
    else {
      local_178 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_1>
                  ::data((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_1>
                          *)dest);
    }
    pSVar9 = &SStack_228;
    local_180 = local_178;
  }
  actualDestPtr_stack_memory_destructor._16_8_ = local_180;
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    *(undefined8 *)((long)pSVar9 + -8) = 0x116d0f;
    local_190 = gemv_static_vector_if<double,_-1,_-1,_false>::data
                          ((gemv_static_vector_if<double,__1,__1,_false> *)
                           ((long)&compatibleAlpha + 7));
  }
  else {
    *(undefined8 *)((long)pSVar9 + -8) = 0x116cfd;
    local_190 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_1>
                ::data((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_1>
                        *)dest);
  }
  if (local_190 == (ScalarWithConstIfNotLvalue *)0x0) {
    local_198 = (double *)actualDestPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_198 = (double *)0x0;
  }
  local_1a8 = local_198;
  *(undefined8 *)((long)pSVar9 + -8) = 0x116d55;
  local_1a0 = EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>
              ::size((EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
                      *)dest);
  *(undefined8 *)((long)pSVar9 + -8) = 0x116d65;
  IVar8 = EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>
          ::size((EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
                  *)dest);
  size = local_1a0;
  pdVar3 = local_1a8;
  *(undefined8 *)((long)pSVar9 + -8) = 0x116d92;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_b0,pdVar3,size,
             0x20000 < (ulong)(IVar8 * 8));
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    if ((compatibleAlpha._6_1_ & 1) == 0) {
      local_1b8 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      *(undefined8 *)((long)pSVar9 + -8) = 0x116dbd;
      local_1b0 = EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>
                  ::size((EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
                          *)dest);
      *(undefined8 *)((long)pSVar9 + -8) = 0x116dd2;
      Stride<0,_0>::Stride(local_d6);
      IVar2 = local_1b0;
      pdVar1 = local_1b8;
      *(undefined8 *)((long)pSVar9 + -8) = 0x116df5;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_c8,pdVar1,IVar2,local_d6);
      *(undefined8 *)((long)pSVar9 + -8) = 0x116e03;
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>::
      setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>
               *)&local_c8);
      actualDestPtr = (ResScalar *)0x3ff0000000000000;
    }
    else {
      local_1c8 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      local_1d0 = (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
                   *)dest;
      *(undefined8 *)((long)pSVar9 + -8) = 0x116e5b;
      local_1c0 = EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>
                  ::size((EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
                          *)dest);
      *(undefined8 *)((long)pSVar9 + -8) = 0x116e70;
      Stride<0,_0>::Stride(&local_f2);
      IVar2 = local_1c0;
      pdVar1 = local_1c8;
      *(undefined8 *)((long)pSVar9 + -8) = 0x116e93;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_f0,pdVar1,IVar2,&local_f2);
      other = local_1d0;
      *(undefined8 *)((long)pSVar9 + -8) = 0x116ea8;
      Map<Eigen::Matrix<double,-1,1,0,-1,1>,1,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>> *)&local_f0,other);
    }
  }
  IVar4 = actualRhs.m_matrix.
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
          .m_outerStride;
  *(undefined8 *)((long)pSVar9 + -8) = 0x116eb7;
  local_1e8 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
              ::rows((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
                      *)IVar4);
  IVar4 = actualRhs.m_matrix.
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
          .m_outerStride;
  *(undefined8 *)((long)pSVar9 + -8) = 0x116ec7;
  local_1e0 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
              ::cols((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
                      *)IVar4);
  IVar4 = actualRhs.m_matrix.
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
          .m_outerStride;
  *(undefined8 *)((long)pSVar9 + -8) = 0x116ed7;
  local_1d8 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_1>
              ::data((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
                      *)IVar4);
  IVar4 = actualRhs.m_matrix.
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false,_true>
          .m_outerStride;
  *(undefined8 *)((long)pSVar9 + -8) = 0x116ee9;
  local_1f0 = BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false,_true>
              ::outerStride((BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
                             *)IVar4);
  *(undefined8 *)((long)pSVar9 + -8) = 0x116efb;
  local_1f8 = TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>,_Eigen::Dense>
              ::data((TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_Eigen::Dense>
                      *)&actualAlpha);
  *(undefined8 *)((long)pSVar9 + -8) = 0x116f0d;
  rhsIncr = TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_-1,_false>,_Eigen::Dense>
            ::innerStride((TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1,__1,_false>,_Eigen::Dense>
                           *)&actualAlpha);
  lhs = local_1d8;
  cols = local_1e0;
  rows = local_1e8;
  lhsStride = local_1f0;
  pdVar3 = local_1f8;
  local_200 = rhsIncr;
  *(undefined8 *)((long)pSVar9 + -0x10) = actualDestPtr_stack_memory_destructor._16_8_;
  *(undefined8 *)((long)pSVar9 + -8) = 1;
  *(undefined8 *)((long)pSVar9 + -0x18) = 0x116f66;
  general_matrix_vector_product<long,_double,_0,_false,_double,_false,_0>::run
            (rows,cols,lhs,lhsStride,pdVar3,rhsIncr,*(ResScalar **)((long)pSVar9 + -0x10),
             *(long *)((long)pSVar9 + -8),(double)actualDestPtr);
  if ((compatibleAlpha._5_1_ & 1) == 0) {
    if ((compatibleAlpha._6_1_ & 1) == 0) {
      local_210 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      *(undefined8 *)((long)pSVar9 + -8) = 0x116f93;
      local_208 = EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>
                  ::size((EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
                          *)dest);
      *(undefined8 *)((long)pSVar9 + -8) = 0x116fa8;
      Stride<0,_0>::Stride(&local_132);
      IVar2 = local_208;
      pdVar1 = local_210;
      *(undefined8 *)((long)pSVar9 + -8) = 0x116fcb;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_130,pdVar1,IVar2,&local_132);
      *(undefined8 *)((long)pSVar9 + -8) = 0x116fe4;
      Eigen::operator*(&local_118,&stack0xffffffffffffff80,(StorageBaseType *)&local_130);
      *(undefined8 *)((long)pSVar9 + -8) = 0x116ff6;
      MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,false>>
      ::operator+=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,false>>
                    *)dest,(MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
                            *)&local_118);
    }
    else {
      local_220 = (PointerArgType)actualDestPtr_stack_memory_destructor._16_8_;
      *(undefined8 *)((long)pSVar9 + -8) = 0x117011;
      local_218 = EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>
                  ::size((EigenBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>
                          *)dest);
      *(undefined8 *)((long)pSVar9 + -8) = 0x117026;
      Stride<0,_0>::Stride(&local_152);
      IVar2 = local_218;
      pdVar1 = local_220;
      *(undefined8 *)((long)pSVar9 + -8) = 0x117049;
      Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>::Map
                (&local_150,pdVar1,IVar2,&local_152);
      *(undefined8 *)((long)pSVar9 + -8) = 0x11705b;
      Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,false>::operator=
                ((Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,false> *)
                 dest,(DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>
                       *)&local_150);
    }
  }
  *(undefined8 *)((long)pSVar9 + -8) = 0x11706d;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_b0);
  return;
}

Assistant:

static inline void run(const ProductType& prod, Dest& dest, const typename ProductType::Scalar& alpha)
  {
    typedef typename ProductType::Index Index;
    typedef typename ProductType::LhsScalar   LhsScalar;
    typedef typename ProductType::RhsScalar   RhsScalar;
    typedef typename ProductType::Scalar      ResScalar;
    typedef typename ProductType::RealScalar  RealScalar;
    typedef typename ProductType::ActualLhsType ActualLhsType;
    typedef typename ProductType::ActualRhsType ActualRhsType;
    typedef typename ProductType::LhsBlasTraits LhsBlasTraits;
    typedef typename ProductType::RhsBlasTraits RhsBlasTraits;
    typedef Map<Matrix<ResScalar,Dynamic,1>, Aligned> MappedDest;

    ActualLhsType actualLhs = LhsBlasTraits::extract(prod.lhs());
    ActualRhsType actualRhs = RhsBlasTraits::extract(prod.rhs());

    ResScalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(prod.lhs())
                                  * RhsBlasTraits::extractScalarFactor(prod.rhs());

    // make sure Dest is a compile-time vector type (bug 1166)
    typedef typename conditional<Dest::IsVectorAtCompileTime, Dest, typename Dest::ColXpr>::type ActualDest;

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      EvalToDestAtCompileTime = (ActualDest::InnerStrideAtCompileTime==1),
      ComplexByReal = (NumTraits<LhsScalar>::IsComplex) && (!NumTraits<RhsScalar>::IsComplex),
      MightCannotUseDest = (ActualDest::InnerStrideAtCompileTime!=1) || ComplexByReal
    };

    gemv_static_vector_if<ResScalar,ActualDest::SizeAtCompileTime,ActualDest::MaxSizeAtCompileTime,MightCannotUseDest> static_dest;

    bool alphaIsCompatible = (!ComplexByReal) || (numext::imag(actualAlpha)==RealScalar(0));
    bool evalToDest = EvalToDestAtCompileTime && alphaIsCompatible;
    
    RhsScalar compatibleAlpha = get_factor<ResScalar,RhsScalar>::run(actualAlpha);

    ei_declare_aligned_stack_constructed_variable(ResScalar,actualDestPtr,dest.size(),
                                                  evalToDest ? dest.data() : static_dest.data());
    
    if(!evalToDest)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      int size = dest.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      if(!alphaIsCompatible)
      {
        MappedDest(actualDestPtr, dest.size()).setZero();
        compatibleAlpha = RhsScalar(1);
      }
      else
        MappedDest(actualDestPtr, dest.size()) = dest;
    }

    general_matrix_vector_product
      <Index,LhsScalar,ColMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        actualLhs.data(), actualLhs.outerStride(),
        actualRhs.data(), actualRhs.innerStride(),
        actualDestPtr, 1,
        compatibleAlpha);

    if (!evalToDest)
    {
      if(!alphaIsCompatible)
        dest += actualAlpha * MappedDest(actualDestPtr, dest.size());
      else
        dest = MappedDest(actualDestPtr, dest.size());
    }
  }